

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Optional.h
# Opt level: O0

OptionalStorage<llbuild::buildsystem::BuildValue,_false> * __thiscall
llvm::optional_detail::OptionalStorage<llbuild::buildsystem::BuildValue,_false>::operator=
          (OptionalStorage<llbuild::buildsystem::BuildValue,_false> *this,
          OptionalStorage<llbuild::buildsystem::BuildValue,_false> *O)

{
  BuildValue *y;
  OptionalStorage<llbuild::buildsystem::BuildValue,_false> *O_local;
  OptionalStorage<llbuild::buildsystem::BuildValue,_false> *this_local;
  
  if ((O->hasVal & 1U) == 0) {
    reset(this);
  }
  else {
    y = getPointer(O);
    operator=(this,y);
  }
  return this;
}

Assistant:

OptionalStorage &operator=(OptionalStorage &&O) {
    if (!O.hasVal)
      reset();
    else {
      *this = std::move(*O.getPointer());
    }
    return *this;
  }